

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

bool __thiscall MeCab::Writer::writeNode(Writer *this,Lattice *lattice,Node *node,StringBuffer *os)

{
  long in_RDX;
  long in_RDI;
  StringBuffer *in_stack_00000128;
  Node *in_stack_00000130;
  char *in_stack_00000138;
  Lattice *in_stack_00000140;
  Writer *in_stack_00000148;
  bool local_1;
  
  switch(*(undefined1 *)(in_RDX + 0x4f)) {
  case 0:
    scoped_array<char>::get((scoped_array<char> *)(in_RDI + 8));
    local_1 = writeNode(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                        in_stack_00000128);
    break;
  case 1:
    scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x38));
    local_1 = writeNode(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                        in_stack_00000128);
    break;
  case 2:
    scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x18));
    local_1 = writeNode(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                        in_stack_00000128);
    break;
  case 3:
    scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x28));
    local_1 = writeNode(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                        in_stack_00000128);
    break;
  case 4:
    scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x48));
    local_1 = writeNode(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                        in_stack_00000128);
    break;
  default:
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Writer::writeNode(Lattice *lattice, const Node *node,
                       StringBuffer *os) const {
  switch (node->stat) {
    case MECAB_BOS_NODE:
      return writeNode(lattice, bos_format_.get(), node, os);
    case MECAB_EOS_NODE:
      return writeNode(lattice, eos_format_.get(), node, os);
    case MECAB_UNK_NODE:
      return writeNode(lattice, unk_format_.get(), node, os);
    case MECAB_NOR_NODE:
      return writeNode(lattice, node_format_.get(), node, os);
    case MECAB_EON_NODE:
      return writeNode(lattice, eon_format_.get(), node, os);
  }
  return true;
}